

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O3

bool __thiscall OpenMD::SimSnapshotManager::resetToPrevious(SimSnapshotManager *this)

{
  Snapshot *this_00;
  Snapshot *pSVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined2 uVar31;
  int id;
  
  id = Snapshot::getID((this->super_SnapshotManager).previousSnapshot_);
  this_00 = (this->super_SnapshotManager).currentSnapshot_;
  pSVar1 = (this->super_SnapshotManager).previousSnapshot_;
  DataStorage::operator=(&this_00->atomData,&pSVar1->atomData);
  DataStorage::operator=(&this_00->rigidbodyData,&pSVar1->rigidbodyData);
  DataStorage::operator=(&this_00->cgData,&pSVar1->cgData);
  FrameData::operator=(&this_00->frameData,&pSVar1->frameData);
  bVar2 = pSVar1->hasTranslationalKineticEnergy;
  bVar3 = pSVar1->hasRotationalKineticEnergy;
  bVar4 = pSVar1->hasElectronicKineticEnergy;
  bVar5 = pSVar1->hasKineticEnergy;
  bVar6 = pSVar1->hasShortRangePotential;
  bVar7 = pSVar1->hasLongRangePotential;
  bVar8 = pSVar1->hasExcludedPotential;
  bVar9 = pSVar1->hasSelfPotential;
  bVar10 = pSVar1->hasPotentialEnergy;
  bVar11 = pSVar1->hasXYarea;
  bVar12 = pSVar1->hasXZarea;
  bVar13 = pSVar1->hasYZarea;
  bVar14 = pSVar1->hasVolume;
  bVar15 = pSVar1->hasPressure;
  bVar16 = pSVar1->hasTemperature;
  bVar17 = pSVar1->hasElectronicTemperature;
  bVar18 = pSVar1->hasNetCharge;
  bVar19 = pSVar1->hasChargeMomentum;
  bVar20 = pSVar1->hasCOM;
  bVar21 = pSVar1->hasCOMvel;
  bVar22 = pSVar1->hasCOMw;
  bVar23 = pSVar1->hasPressureTensor;
  bVar24 = pSVar1->hasSystemDipole;
  bVar25 = pSVar1->hasSystemQuadrupole;
  bVar26 = pSVar1->hasConvectiveHeatFlux;
  bVar27 = pSVar1->hasInertiaTensor;
  bVar28 = pSVar1->hasGyrationalVolume;
  bVar29 = pSVar1->hasHullVolume;
  bVar30 = pSVar1->hasBoundingBox;
  uVar31 = *(undefined2 *)&pSVar1->field_0xa8e;
  this_00->hasTotalEnergy = pSVar1->hasTotalEnergy;
  this_00->hasTranslationalKineticEnergy = bVar2;
  this_00->hasRotationalKineticEnergy = bVar3;
  this_00->hasElectronicKineticEnergy = bVar4;
  this_00->hasKineticEnergy = bVar5;
  this_00->hasShortRangePotential = bVar6;
  this_00->hasLongRangePotential = bVar7;
  this_00->hasExcludedPotential = bVar8;
  this_00->hasSelfPotential = bVar9;
  this_00->hasPotentialEnergy = bVar10;
  this_00->hasXYarea = bVar11;
  this_00->hasXZarea = bVar12;
  this_00->hasYZarea = bVar13;
  this_00->hasVolume = bVar14;
  this_00->hasPressure = bVar15;
  this_00->hasTemperature = bVar16;
  this_00->hasElectronicTemperature = bVar17;
  this_00->hasNetCharge = bVar18;
  this_00->hasChargeMomentum = bVar19;
  this_00->hasCOM = bVar20;
  this_00->hasCOMvel = bVar21;
  this_00->hasCOMw = bVar22;
  this_00->hasPressureTensor = bVar23;
  this_00->hasSystemDipole = bVar24;
  this_00->hasSystemQuadrupole = bVar25;
  this_00->hasConvectiveHeatFlux = bVar26;
  this_00->hasInertiaTensor = bVar27;
  this_00->hasGyrationalVolume = bVar28;
  this_00->hasHullVolume = bVar29;
  this_00->hasBoundingBox = bVar30;
  *(undefined2 *)&this_00->field_0xa8e = uVar31;
  this_00->orthoTolerance_ = pSVar1->orthoTolerance_;
  Snapshot::setID((this->super_SnapshotManager).currentSnapshot_,id);
  return true;
}

Assistant:

bool SimSnapshotManager::resetToPrevious() {
    int prevID        = previousSnapshot_->getID();
    *currentSnapshot_ = *previousSnapshot_;
    currentSnapshot_->setID(prevID);
    return true;
  }